

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O2

void leveldb_writebatch_iterate
               (leveldb_writebatch_t *b,void *state,
               _func_void_void_ptr_char_ptr_size_t_char_ptr_size_t *put,
               _func_void_void_ptr_char_ptr_size_t *deleted)

{
  H handler;
  WriteBatch WStack_38;
  _func_void_void_ptr_char_ptr_size_t *local_18;
  
  WStack_38.rep_._M_string_length = (size_type)&PTR__Handler_001330d0;
  WStack_38.rep_.field_2._M_allocated_capacity = (size_type)state;
  WStack_38.rep_.field_2._8_8_ = put;
  local_18 = deleted;
  leveldb::WriteBatch::Iterate(&WStack_38,(Handler *)b);
  leveldb::Status::~Status((Status *)&WStack_38);
  leveldb::WriteBatch::Handler::~Handler((Handler *)&WStack_38.rep_._M_string_length);
  return;
}

Assistant:

void leveldb_writebatch_iterate(const leveldb_writebatch_t* b, void* state,
                                void (*put)(void*, const char* k, size_t klen,
                                            const char* v, size_t vlen),
                                void (*deleted)(void*, const char* k,
                                                size_t klen)) {
  class H : public WriteBatch::Handler {
   public:
    void* state_;
    void (*put_)(void*, const char* k, size_t klen, const char* v, size_t vlen);
    void (*deleted_)(void*, const char* k, size_t klen);
    void Put(const Slice& key, const Slice& value) override {
      (*put_)(state_, key.data(), key.size(), value.data(), value.size());
    }
    void Delete(const Slice& key) override {
      (*deleted_)(state_, key.data(), key.size());
    }
  };
  H handler;
  handler.state_ = state;
  handler.put_ = put;
  handler.deleted_ = deleted;
  b->rep.Iterate(&handler);
}